

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestObject::~TestObject(TestObject *this)

{
  DebugComparison<int_&,_int_&> _kjCondition;
  Fault f;
  
  if (this->index == -1) {
    (anonymous_namespace)::TestObject::copiedCount =
         (anonymous_namespace)::TestObject::copiedCount + -1;
  }
  else {
    (anonymous_namespace)::TestObject::count = (anonymous_namespace)::TestObject::count + -1;
    _kjCondition.result = this->index == (anonymous_namespace)::TestObject::count;
    _kjCondition.right = &(anonymous_namespace)::TestObject::count;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
      _kjCondition.left = &this->index;
      _::Debug::log<char_const(&)[36],kj::_::DebugComparison<int&,int&>&,int&,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x30,ERROR,
                 "\"failed: expected \" \"(index) == (count)\", _kjCondition, index, count",
                 (char (*) [36])"failed: expected (index) == (count)",&_kjCondition,&this->index,
                 &(anonymous_namespace)::TestObject::count);
    }
    _kjCondition.left = &(anonymous_namespace)::TestObject::count;
    _kjCondition.right = &(anonymous_namespace)::TestObject::throwAt;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.result =
         (anonymous_namespace)::TestObject::count != (anonymous_namespace)::TestObject::throwAt;
    _kjCondition.op.content.size_ = 5;
    if (!_kjCondition.result) {
      _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int&>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x31,FAILED,"count != throwAt","_kjCondition,",&_kjCondition);
      _::Debug::Fault::fatal(&f);
    }
  }
  return;
}

Assistant:

~TestObject() noexcept(false) {
    if (index == -1) {
      --copiedCount;
    } else {
      --count;
      EXPECT_EQ(index, count);
      KJ_ASSERT(count != throwAt);
    }
  }